

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_swap(DisasContext_conflict14 *ctx,int reg,TCGv_i32 ea)

{
  TCGContext_conflict9 *s;
  TCGTemp *a2;
  uintptr_t o_1;
  TCGv_i32 val;
  
  s = ctx->uc->tcg_ctx;
  a2 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  val = (TCGv_i32)((long)a2 - (long)s);
  tcg_gen_qemu_ld_i32_tricore(s,val,ea,(long)ctx->mem_idx,MO_32);
  tcg_gen_qemu_st_i32_tricore(s,s->cpu_gpr_d[(uint)reg],ea,(long)ctx->mem_idx,MO_32);
  if (s->cpu_gpr_d[(uint)reg] != val) {
    tcg_gen_op2_tricore(s,INDEX_op_mov_i32,(TCGArg)(s->cpu_gpr_d[(uint)reg] + (long)s),(TCGArg)a2);
  }
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(val + (long)s));
  return;
}

Assistant:

static void gen_swap(DisasContext *ctx, int reg, TCGv ea)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);

    tcg_gen_qemu_ld_tl(tcg_ctx, temp, ea, ctx->mem_idx, MO_LEUL);
    tcg_gen_qemu_st_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[reg], ea, ctx->mem_idx, MO_LEUL);
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[reg], temp);

    tcg_temp_free(tcg_ctx, temp);
}